

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

void __thiscall Assimp::Ogre::Mesh::Mesh(Mesh *this)

{
  Mesh *this_local;
  
  this->hasSkeletalAnimations = false;
  std::__cxx11::string::string((string *)&this->skeletonRef);
  this->skeleton = (Skeleton *)0x0;
  this->sharedVertexData = (VertexData *)0x0;
  memset(&this->subMeshes,0,0x18);
  std::vector<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>::vector
            (&this->subMeshes);
  memset(&this->animations,0,0x18);
  std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>::vector
            (&this->animations);
  memset(&this->poses,0,0x18);
  std::vector<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>::vector(&this->poses);
  return;
}

Assistant:

Mesh::Mesh() 
    : hasSkeletalAnimations(false)
    , skeleton(NULL)
    , sharedVertexData(NULL)
    , subMeshes()
    , animations()
    , poses()
{
}